

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int test(void)

{
  char extraout_AL;
  char extraout_AL_00;
  int iVar1;
  ostream *poVar2;
  NoCopy *pNVar3;
  char *pcVar4;
  int iVar5;
  mock<My,_MyMock> mVar6;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  uint uVar7;
  int iVar8;
  _Any_data *this;
  int in_R8D;
  float fVar9;
  mock<My,_MyMock> mock;
  raii_mock<const_char_*(int,_char)> _mockaron_function_mock74;
  My real;
  raii_mock<float_(float)> _mockaron_function_mock85;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  My::My(&real,3.14);
  iVar1 = My::f(&real,4);
  if (iVar1 != 0x10) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Check failed: real.f(4) == 16");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  uVar7 = (uint)(iVar1 != 0x10);
  mockaron::mock<My,_MyMock>::mock(&mock);
  iVar1 = My::f((My *)&mock,4);
  if (iVar1 != 8) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Check failed: mock.get().f(4) == 8");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar7 = uVar7 + 1;
  }
  _mockaron_function_mock74.ref._0_4_ = 4;
  iVar1 = My::g((My *)&mock,(int *)&_mockaron_function_mock74);
  if (iVar1 != 8) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Check failed: mock.get().g(4) == 8");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar7 = uVar7 + 1;
  }
  fVar9 = My::g((My *)&mock,2.0);
  if ((fVar9 != 4.0) || (NAN(fVar9))) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Check failed: mock.get().g(2.0f) == 4.0f");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar7 = uVar7 + 1;
  }
  iVar1 = My::h((My *)&mock,2);
  if (iVar1 != 4) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Check failed: mock.get().h(2) == 4");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar7 = uVar7 + 1;
  }
  iVar1 = My::i((My *)&mock);
  if (iVar1 != 2) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Check failed: mock.get().i() == 2");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar7 = uVar7 + 1;
  }
  My::j((My *)&mock);
  pNVar3 = My::k((My *)&mock);
  mVar6 = mock;
  if (pNVar3 != (NoCopy *)((long)&mock._p[1]._vptr_mock_impl + 4)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "Check failed: &mock.get().k() == &mock.get_mock_impl().no");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar7 = uVar7 + 1;
    mVar6 = mock;
  }
  if (*(int *)&mVar6._p[1]._vptr_mock_impl != 0x2a) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Check failed: mock.get_mock_impl().z == 42");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar7 = uVar7 + 1;
  }
  iVar5 = (int)mVar6._p;
  iVar1 = My::f(&real,4);
  if (iVar1 != 0x10) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Check failed: real.f(4) == 16");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar7 = uVar7 + 1;
  }
  poVar2 = (ostream *)My::l(8,'\0');
  iVar8 = 0x10612e;
  iVar1 = strcmp((char *)poVar2,"fortytwo");
  pcVar4 = extraout_RDX;
  if (iVar1 != 0) {
    iVar8 = 0x106137;
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "Check failed: !std::strcmp(My::l(8, 0), \"fortytwo\")");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar7 = uVar7 + 1;
    pcVar4 = extraout_RDX_00;
  }
  My::m(poVar2,iVar8,pcVar4,iVar5,in_R8D);
  if (extraout_AL != '\0') {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Check failed: !My::m()");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar7 = uVar7 + 1;
  }
  iVar1 = My::n(2);
  if (iVar1 != 4) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Check failed: My::n(2) == 4");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar7 = uVar7 + 1;
  }
  fVar9 = My::n(2.0);
  if ((fVar9 != 4.0) || (NAN(fVar9))) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Check failed: My::n(2.f) == 4.f");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar7 = uVar7 + 1;
  }
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<const_char_*(int,_char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/TankerHQ[P]mockaron/test/test.cpp:70:5)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<const_char_*(int,_char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/TankerHQ[P]mockaron/test/test.cpp:70:5)>
             ::_M_manager;
  mockaron::detail::raii_mock<const_char_*(int,_char)>::raii_mock
            (&_mockaron_function_mock74,My::l,(function<const_char_*(int,_char)> *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  pcVar4 = My::l(8,'\0');
  iVar1 = strcmp(pcVar4,"roflol");
  if (iVar1 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "Check failed: !std::strcmp(My::l(8, 0), \"roflol\")");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar7 = uVar7 + 1;
  }
  mockaron::detail::raii_mock<const_char_*(int,_char)>::~raii_mock(&_mockaron_function_mock74);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/TankerHQ[P]mockaron/test/test.cpp:78:5)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/TankerHQ[P]mockaron/test/test.cpp:78:5)>
             ::_M_manager;
  iVar1 = 0x104352;
  mockaron::detail::raii_mock<bool_()>::raii_mock
            ((raii_mock<bool_()> *)&_mockaron_function_mock74,My::m,(function<bool_()> *)&local_48);
  this = &local_48;
  std::_Function_base::~_Function_base((_Function_base *)this);
  My::m(this,iVar1,extraout_RDX_01,iVar5,in_R8D);
  if (extraout_AL_00 == '\0') {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Check failed: My::m()");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar7 = uVar7 + 1;
  }
  mockaron::detail::raii_mock<bool_()>::~raii_mock((raii_mock<bool_()> *)&_mockaron_function_mock74)
  ;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/TankerHQ[P]mockaron/test/test.cpp:82:5)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/TankerHQ[P]mockaron/test/test.cpp:82:5)>
             ::_M_manager;
  mockaron::detail::raii_mock<int_(int)>::raii_mock
            ((raii_mock<int_(int)> *)&_mockaron_function_mock74,My::n,
             (function<int_(int)> *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/TankerHQ[P]mockaron/test/test.cpp:84:5)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/TankerHQ[P]mockaron/test/test.cpp:84:5)>
             ::_M_manager;
  mockaron::detail::raii_mock<float_(float)>::raii_mock
            (&_mockaron_function_mock85,My::n,(function<float_(float)> *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  iVar1 = My::n(2);
  if (iVar1 != 8) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Check failed: My::n(2) == 8");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar7 = uVar7 + 1;
  }
  fVar9 = My::n(2.0);
  if ((fVar9 != 16.0) || (NAN(fVar9))) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Check failed: My::n(2.f) == 16.f");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar7 = uVar7 + 1;
  }
  mockaron::detail::raii_mock<float_(float)>::~raii_mock(&_mockaron_function_mock85);
  mockaron::detail::raii_mock<int_(int)>::~raii_mock
            ((raii_mock<int_(int)> *)&_mockaron_function_mock74);
  mockaron::mock<My,_MyMock>::~mock(&mock);
  My::~My(&real);
  return uVar7;
}

Assistant:

int test()
{
  int failure = 0;
  My real(3.14);
  CHECK(real.f(4) == 16);

  mockaron::mock<My, MyMock> mock;

  CHECK(mock.get().f(4) == 8);
  CHECK(mock.get().g(4) == 8);
  CHECK(mock.get().g(2.0f) == 4.0f);
  CHECK(mock.get().h(2) == 4);
  CHECK(mock.get().i() == 2);
  mock.get().j();
  CHECK(&mock.get().k() == &mock.get_mock_impl().no);
  CHECK(mock.get_mock_impl().z == 42);

  CHECK(real.f(4) == 16);

  CHECK(!std::strcmp(My::l(8, 0), "fortytwo"));
  CHECK(!My::m());
  CHECK(My::n(2) == 4);
  CHECK(My::n(2.f) == 4.f);

  {
    MOCKARON_SET_FUNCTION_IMPL(My::l, [](int i, char) {
      if (i == 8)
        return "roflol";
      return (char const*)nullptr;
    });
    CHECK(!std::strcmp(My::l(8, 0), "roflol"));
  }
  {
    MOCKARON_SET_FUNCTION_IMPL(My::m, []() { return true; });
    CHECK(My::m());
  }
  {
    MOCKARON_SET_FUNCTION_IMPL(static_cast<int (*)(int)>(My::n),
                               [](int i) { return i * 4; });
    MOCKARON_SET_FUNCTION_IMPL(static_cast<float (*)(float)>(My::n),
                               [](float i) { return i * 8; });
    CHECK(My::n(2) == 8);
    CHECK(My::n(2.f) == 16.f);
  }

  return failure;
}